

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelOverridesProperties::~IfcRelOverridesProperties
          (IfcRelOverridesProperties *this,void **vtt)

{
  void *pvVar1;
  undefined1 *puVar2;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines = pvVar1;
  *(void **)(&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x0 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0x19];
  *(void **)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x88 = vtt[0x1a];
  (this->super_IfcRelDefinesByProperties).super_IfcRelDefines.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x1b];
  *(void **)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0xc0 = vtt[0x1c];
  *(void **)&(this->super_IfcRelDefinesByProperties).field_0xd8 = vtt[0x1d];
  pvVar1 = *(void **)&(this->super_IfcRelDefinesByProperties).field_0xe8;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  pvVar1 = vtt[2];
  *(void **)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines = pvVar1;
  *(void **)(&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x0 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0xe];
  *(void **)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x88 = vtt[0xf];
  (this->super_IfcRelDefinesByProperties).super_IfcRelDefines.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x10];
  pvVar1 = *(void **)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>.field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  pvVar1 = vtt[4];
  *(void **)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines = pvVar1;
  *(void **)(&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x0 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[7];
  puVar2 = *(undefined1 **)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x60;
  if (puVar2 != &(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x70) {
    operator_delete(puVar2);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x38;
  if (puVar2 != &(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x48) {
    operator_delete(puVar2);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x10;
  if (puVar2 != &(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x20) {
    operator_delete(puVar2);
    return;
  }
  return;
}

Assistant:

IfcRelOverridesProperties() : Object("IfcRelOverridesProperties") {}